

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O3

HashEntry * raviX_hash_table_search_pre_hashed(HashTable *ht,uint32_t hash,void *key)

{
  HashEntry *pHVar1;
  uint32_t *puVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar5 = ht->size;
  uVar3 = (ulong)uVar5;
  uVar6 = (ulong)hash % uVar3;
  do {
    puVar2 = (uint32_t *)ht->table[uVar6].key;
    if (puVar2 == (uint32_t *)0x0) {
      return (HashEntry *)0x0;
    }
    if ((puVar2 != &deleted_key_value) && (pHVar1 = ht->table + uVar6, pHVar1->hash == hash)) {
      iVar4 = (*ht->key_equals_function)(key,puVar2);
      if (iVar4 != 0) {
        return pHVar1;
      }
      uVar5 = ht->size;
    }
    uVar6 = (ulong)((int)uVar6 + 1 + hash % ht->rehash) % (ulong)uVar5;
  } while ((int)uVar6 != (int)((ulong)hash % uVar3));
  return (HashEntry *)0x0;
}

Assistant:

HashEntry *
raviX_hash_table_search_pre_hashed(HashTable *ht, uint32_t hash,
			     const void *key)
{
	uint32_t start_hash_address = hash % ht->size;
	uint32_t hash_address = start_hash_address;

	do {
		uint32_t double_hash;

		HashEntry *entry = ht->table + hash_address;

		if (entry_is_free(entry)) {
			return NULL;
		} else if (entry_is_present(entry) && entry->hash == hash) {
			if (ht->key_equals_function(key, entry->key)) {
				return entry;
			}
		}

		double_hash = 1 + hash % ht->rehash;

		hash_address = (hash_address + double_hash) % ht->size;
	} while (hash_address != start_hash_address);

	return NULL;
}